

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralProduct.h
# Opt level: O0

void Eigen::internal::gemv_dense_selector<2,0,true>::
     run<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::Matrix<float,_1,1,0,_1,1>>
               (Matrix<float,__1,__1,_0,__1,__1> *lhs,Matrix<float,__1,_1,_0,__1,_1> *rhs,
               Matrix<float,__1,_1,_0,__1,_1> *dest,Scalar *alpha)

{
  float fVar1;
  Index rows;
  Index cols;
  Scalar *pSVar2;
  Scalar *pSVar3;
  Scalar SVar4;
  Scalar SVar5;
  const_blas_data_mapper<float,_long,_1> local_100;
  const_blas_data_mapper<float,_long,_0> local_f0;
  Real local_e0;
  float local_dc;
  RhsScalar compatibleAlpha;
  ResScalar actualAlpha;
  ActualRhsType actualRhs;
  ActualLhsType actualLhs;
  Scalar *alpha_local;
  Matrix<float,__1,_1,_0,__1,_1> *dest_local;
  Matrix<float,__1,_1,_0,__1,_1> *rhs_local;
  Matrix<float,__1,__1,_0,__1,__1> *lhs_local;
  Scalar *local_a0;
  const_blas_data_mapper<float,_long,_0> *local_98;
  Index local_90;
  Scalar *local_88;
  const_blas_data_mapper<float,_long,_1> *local_80;
  undefined8 local_78;
  Matrix<float,__1,__1,_0,__1,__1> *local_70;
  Scalar *local_68;
  const_blas_data_mapper<float,_long,_0> *local_60;
  undefined8 local_58;
  Index local_50;
  Scalar *local_48;
  const_blas_data_mapper<float,_long,_1> *local_40;
  Matrix<float,__1,_1,_0,__1,_1> *local_38;
  Matrix<float,__1,_1,_0,__1,_1> *local_30;
  ActualLhsType local_28;
  Matrix<float,__1,_1,_0,__1,_1> *local_20;
  Matrix<float,__1,_1,_0,__1,_1> *local_18;
  ActualLhsType local_10;
  
  actualLhs = (ActualLhsType)alpha;
  alpha_local = (Scalar *)dest;
  dest_local = rhs;
  rhs_local = (Matrix<float,__1,_1,_0,__1,_1> *)lhs;
  actualRhs = (ActualRhsType)blas_traits<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::extract(lhs);
  _compatibleAlpha =
       &blas_traits<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::extract(dest_local)->
        super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>;
  local_28 = actualLhs;
  local_30 = rhs_local;
  local_38 = dest_local;
  local_10 = actualLhs;
  local_18 = rhs_local;
  local_20 = dest_local;
  fVar1 = *(float *)&(actualLhs->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).
                     m_storage.m_data;
  SVar4 = blas_traits<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::extractScalarFactor
                    ((Matrix<float,__1,__1,_0,__1,__1> *)rhs_local);
  SVar5 = blas_traits<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::extractScalarFactor(local_20);
  local_dc = fVar1 * SVar4 * SVar5;
  local_e0 = get_factor<float,_float>::run(&local_dc);
  rows = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::rows
                   ((PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)actualRhs);
  cols = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::cols
                   ((PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)actualRhs);
  pSVar2 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::data
                     ((PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)actualRhs);
  lhs_local = (Matrix<float,__1,__1,_0,__1,__1> *)
              Matrix<float,_-1,_-1,_0,_-1,_-1>::outerStride
                        ((Matrix<float,__1,__1,_0,__1,__1> *)actualRhs);
  local_98 = &local_f0;
  local_78 = 1;
  local_a0 = pSVar2;
  local_70 = lhs_local;
  local_68 = pSVar2;
  local_60 = local_98;
  local_f0.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data = pSVar2;
  local_f0.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_stride = (long)lhs_local;
  pSVar3 = PlainObjectBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::data(_compatibleAlpha);
  local_90 = Matrix<float,_-1,_1,_0,_-1,_1>::innerStride
                       ((Matrix<float,__1,_1,_0,__1,_1> *)_compatibleAlpha);
  local_80 = &local_100;
  local_58 = 1;
  local_88 = pSVar3;
  local_50 = local_90;
  local_48 = pSVar3;
  local_40 = local_80;
  local_100.super_blas_data_mapper<const_float,_long,_1,_0,_1>.m_data = pSVar3;
  local_100.super_blas_data_mapper<const_float,_long,_1,_0,_1>.m_stride = local_90;
  pSVar3 = PlainObjectBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::data
                     ((PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)alpha_local);
  general_matrix_vector_product<long,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_0,_false,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_1>,_false,_0>
  ::run(rows,cols,&local_f0,&local_100,pSVar3,1,local_e0);
  return;
}

Assistant:

static inline void run(const Lhs &lhs, const Rhs &rhs, Dest& dest, const typename Dest::Scalar& alpha)
  {
    typedef typename Lhs::Scalar   LhsScalar;
    typedef typename Rhs::Scalar   RhsScalar;
    typedef typename Dest::Scalar  ResScalar;
    typedef typename Dest::RealScalar  RealScalar;
    
    typedef internal::blas_traits<Lhs> LhsBlasTraits;
    typedef typename LhsBlasTraits::DirectLinearAccessType ActualLhsType;
    typedef internal::blas_traits<Rhs> RhsBlasTraits;
    typedef typename RhsBlasTraits::DirectLinearAccessType ActualRhsType;
  
    typedef Map<Matrix<ResScalar,Dynamic,1>, EIGEN_PLAIN_ENUM_MIN(AlignedMax,internal::packet_traits<ResScalar>::size)> MappedDest;

    ActualLhsType actualLhs = LhsBlasTraits::extract(lhs);
    ActualRhsType actualRhs = RhsBlasTraits::extract(rhs);

    ResScalar actualAlpha = combine_scalar_factors(alpha, lhs, rhs);

    // make sure Dest is a compile-time vector type (bug 1166)
    typedef typename conditional<Dest::IsVectorAtCompileTime, Dest, typename Dest::ColXpr>::type ActualDest;

    enum {
      // FIXME find a way to allow an inner stride on the result if packet_traits<Scalar>::size==1
      // on, the other hand it is good for the cache to pack the vector anyways...
      EvalToDestAtCompileTime = (ActualDest::InnerStrideAtCompileTime==1),
      ComplexByReal = (NumTraits<LhsScalar>::IsComplex) && (!NumTraits<RhsScalar>::IsComplex),
      MightCannotUseDest = ((!EvalToDestAtCompileTime) || ComplexByReal) && (ActualDest::MaxSizeAtCompileTime!=0)
    };

    typedef const_blas_data_mapper<LhsScalar,Index,ColMajor> LhsMapper;
    typedef const_blas_data_mapper<RhsScalar,Index,RowMajor> RhsMapper;
    RhsScalar compatibleAlpha = get_factor<ResScalar,RhsScalar>::run(actualAlpha);

    if(!MightCannotUseDest)
    {
      // shortcut if we are sure to be able to use dest directly,
      // this ease the compiler to generate cleaner and more optimzized code for most common cases
      general_matrix_vector_product
          <Index,LhsScalar,LhsMapper,ColMajor,LhsBlasTraits::NeedToConjugate,RhsScalar,RhsMapper,RhsBlasTraits::NeedToConjugate>::run(
          actualLhs.rows(), actualLhs.cols(),
          LhsMapper(actualLhs.data(), actualLhs.outerStride()),
          RhsMapper(actualRhs.data(), actualRhs.innerStride()),
          dest.data(), 1,
          compatibleAlpha);
    }
    else
    {
      gemv_static_vector_if<ResScalar,ActualDest::SizeAtCompileTime,ActualDest::MaxSizeAtCompileTime,MightCannotUseDest> static_dest;

      const bool alphaIsCompatible = (!ComplexByReal) || (numext::imag(actualAlpha)==RealScalar(0));
      const bool evalToDest = EvalToDestAtCompileTime && alphaIsCompatible;

      ei_declare_aligned_stack_constructed_variable(ResScalar,actualDestPtr,dest.size(),
                                                    evalToDest ? dest.data() : static_dest.data());

      if(!evalToDest)
      {
        #ifdef EIGEN_DENSE_STORAGE_CTOR_PLUGIN
        Index size = dest.size();
        EIGEN_DENSE_STORAGE_CTOR_PLUGIN
        #endif
        if(!alphaIsCompatible)
        {
          MappedDest(actualDestPtr, dest.size()).setZero();
          compatibleAlpha = RhsScalar(1);
        }
        else
          MappedDest(actualDestPtr, dest.size()) = dest;
      }

      general_matrix_vector_product
          <Index,LhsScalar,LhsMapper,ColMajor,LhsBlasTraits::NeedToConjugate,RhsScalar,RhsMapper,RhsBlasTraits::NeedToConjugate>::run(
          actualLhs.rows(), actualLhs.cols(),
          LhsMapper(actualLhs.data(), actualLhs.outerStride()),
          RhsMapper(actualRhs.data(), actualRhs.innerStride()),
          actualDestPtr, 1,
          compatibleAlpha);

      if (!evalToDest)
      {
        if(!alphaIsCompatible)
          dest.matrix() += actualAlpha * MappedDest(actualDestPtr, dest.size());
        else
          dest = MappedDest(actualDestPtr, dest.size());
      }
    }
  }